

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

void DumpPtr(textwriter *Text,tchar_t *Name,node *Node,dataid Id,tchar_t *Value,size_t ValueLen)

{
  fourcc_t ClassId;
  undefined4 local_34;
  node *local_30;
  
  local_30 = Node;
  TextAttribEx(Text,Name,&local_30,0,0xf);
  if (local_30 != (node *)0x0) {
    local_34 = *(undefined4 *)((long)local_30->VMT + 8);
    tcscpy_s(Value,0x140,Name);
    tcscat_s(Value,0x140,"_Class");
    TextAttribEx(Text,Value,&local_34,0,8);
  }
  if (Id != 0) {
    local_34 = (undefined4)Id;
    tcscpy_s(Value,0x140,Name);
    tcscat_s(Value,0x140,"_Id");
    TextAttribEx(Text,Value,&local_34,0,2);
  }
  return;
}

Assistant:

static NOINLINE void DumpPtr(textwriter* Text, const tchar_t* Name, node* Node, dataid Id, tchar_t* Value, size_t ValueLen)
{
    TextAttrib(Text,Name,&Node,TYPE_PTR);

    if (Node)
    {
        fourcc_t ClassId = Node_ClassId(Node);
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Class"));
        TextAttrib(Text,Value,&ClassId,TYPE_FOURCC);
    }

    if (Id)
    {
        int i = (int)Id;
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Id"));
        TextAttrib(Text,Value,&i,TYPE_INT);
    }
}